

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

wchar_t prt_title_short(wchar_t row,wchar_t col)

{
  wchar_t wVar1;
  char local_38 [4];
  wchar_t len;
  char buf [32];
  wchar_t col_local;
  wchar_t row_local;
  
  buf._28_4_ = col;
  wVar1 = fmt_title(local_38,L' ',true);
  if (wVar1 < L'\x01') {
    col_local = L'\0';
  }
  else {
    c_put_str('\v',local_38,row,buf._28_4_);
    col_local = wVar1 + L'\x01';
  }
  return col_local;
}

Assistant:

static int prt_title_short(int row, int col)
{
	char buf[32];
	
	int len = fmt_title(buf, sizeof(buf), true);
	if (len > 0) {
		c_put_str(COLOUR_YELLOW, buf, row, col);	
		return len+1;
	}	
	return 0;
}